

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

void __thiscall kj::anon_unknown_36::HttpClientImpl::watchForClose(HttpClientImpl *this)

{
  PromiseArena *pPVar1;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 node;
  undefined8 uVar2;
  void *pvVar3;
  PromiseNode *ptrCopy;
  TransformPromiseNodeBase *this_00;
  OwnPromiseNode intermediate;
  undefined1 local_58 [24];
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 local_40;
  SourceLocation local_38;
  
  HttpInputStreamImpl::awaitNextMessage((HttpInputStreamImpl *)local_58);
  uVar2 = local_58._0_8_;
  pPVar1 = *(PromiseArena **)(local_58._0_8_ + 8);
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_58._0_8_ - (long)pPVar1) < 0x28) {
    pvVar3 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar3 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)local_58,
               kj::_::
               SimpleTransformPromiseNode<bool,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:5705:15)>
               ::anon_class_8_1_8991fb9c_for_func::operator());
    *(undefined ***)((long)pvVar3 + 0x3d8) = &PTR_destroy_00703de8;
    *(HttpClientImpl **)((long)pvVar3 + 0x3f8) = this;
    *(void **)((long)pvVar3 + 0x3e0) = pvVar3;
  }
  else {
    *(PromiseArena **)(local_58._0_8_ + 8) = (PromiseArena *)0x0;
    this_00 = (TransformPromiseNodeBase *)(local_58._0_8_ + -0x28);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)local_58,
               kj::_::
               SimpleTransformPromiseNode<bool,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:5705:15)>
               ::anon_class_8_1_8991fb9c_for_func::operator());
    *(undefined ***)(uVar2 + -0x28) = &PTR_destroy_00703de8;
    *(HttpClientImpl **)(uVar2 + -8) = this;
    ((PromiseArenaMember *)(uVar2 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_38.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h"
  ;
  local_38.function = "then";
  local_38.lineNumber = 0x58b;
  local_38.columnNumber = 0x4c;
  local_58._16_8_ = this_00;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_40,(OwnPromiseNode *)(local_58 + 0x10),&local_38);
  uVar2 = local_58._16_8_;
  local_58._8_8_ = local_40;
  if ((TransformPromiseNodeBase *)local_58._16_8_ != (TransformPromiseNodeBase *)0x0) {
    local_58._16_8_ = (TransformPromiseNodeBase *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar2);
  }
  local_38.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  local_38.function = "watchForClose";
  local_38.lineNumber = 0x1648;
  local_38.columnNumber = 0x18;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::EagerPromiseNode<kj::_::Void>,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_40,(OwnPromiseNode *)(local_58 + 8),&local_38);
  if ((this->closeWatcherTask).ptr.isSet == true) {
    (this->closeWatcherTask).ptr.isSet = false;
    node = (this->closeWatcherTask).ptr.field_1;
    if (node != (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0) {
      (this->closeWatcherTask).ptr.field_1 =
           (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
    }
  }
  uVar2 = local_58._8_8_;
  (this->closeWatcherTask).ptr.field_1 = local_40;
  (this->closeWatcherTask).ptr.isSet = true;
  if ((anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)local_58._8_8_ !=
      (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0) {
    local_58._8_8_ = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar2);
  }
  uVar2 = local_58._0_8_;
  if ((PromiseArenaMember *)local_58._0_8_ != (PromiseArenaMember *)0x0) {
    local_58._0_8_ = (_func_int **)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar2);
  }
  return;
}

Assistant:

void watchForClose() {
    closeWatcherTask = httpInput.awaitNextMessage()
        .then([this](bool hasData) -> kj::Promise<void> {
      if (hasData) {
        // Uhh... The server sent some data before we asked for anything. Perhaps due to properties
        // of this application, the server somehow already knows what the next request will be, and
        // it is trying to optimize. Or maybe this is some sort of test and the server is just
        // replaying a script. In any case, we will humor it -- leave the data in the buffer and
        // let it become the response to the next request.
        return kj::READY_NOW;
      } else {
        // EOF -- server disconnected.
        closed = true;
        if (httpOutput.isInBody()) {
          // Huh, the application is still sending a request. We should let it finish. We do not
          // need to proactively free the socket in this case because we know that we're not
          // sitting in a reusable connection pool, because we know the application is still
          // actively using the connection.
          return kj::READY_NOW;
        } else {
          return httpOutput.flush().then([this]() {
            // We might be sitting in NetworkAddressHttpClient's `availableClients` pool. We don't
            // have a way to notify it to remove this client from the pool; instead, when it tries
            // to pull this client from the pool later, it will notice the client is dead and will
            // discard it then. But, we would like to avoid holding on to a socket forever. So,
            // destroy the socket now.
            // TODO(cleanup): Maybe we should arrange to proactively remove ourselves? Seems
            //   like the code will be awkward.
            ownStream = nullptr;
          });
        }
      }
    }).eagerlyEvaluate(nullptr);
  }